

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O2

int compute_string_offset_proc(Am_Object *self)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Am_Value *pAVar6;
  Am_Drawonable *pAVar7;
  char *pcVar8;
  size_t sVar9;
  ulong uVar10;
  Am_String str;
  Am_Font font;
  Am_Object local_50;
  Am_Object local_48;
  Am_Value old_string_offset_value;
  
  str.data = (Am_String_Data *)0x0;
  pAVar6 = Am_Object::Get(self,0xab,0);
  Am_String::operator=(&str,pAVar6);
  bVar1 = Am_String::Valid(&str);
  iVar3 = 0;
  if (!bVar1) goto LAB_001f1912;
  pAVar6 = Am_Object::Get(self,0xad,0);
  uVar2 = Am_Value::operator_cast_to_int(pAVar6);
  old_string_offset_value.type = 0;
  old_string_offset_value.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar6 = Am_Object::Get(self,0x11d,5);
  Am_Value::operator=(&old_string_offset_value,pAVar6);
  bVar1 = Am_Value::Exists(&old_string_offset_value);
  iVar3 = 0;
  if (bVar1) {
    iVar3 = Am_Value::operator_cast_to_int(&old_string_offset_value);
  }
  pAVar6 = Am_Object::Get(self,0x66,0);
  iVar4 = Am_Value::operator_cast_to_int(pAVar6);
  Am_Object::Am_Object(&local_48,self);
  pAVar7 = GV_a_drawonable(&local_48);
  Am_Object::~Am_Object(&local_48);
  pAVar6 = Am_Object::Get(self,0xac,0);
  Am_Font::Am_Font(&font,pAVar6);
  pcVar8 = Am_String::operator_cast_to_char_(&str);
  sVar9 = strlen(pcVar8);
  pcVar8 = Am_String::operator_cast_to_char_(&str);
  iVar5 = (*pAVar7->_vptr_Am_Drawonable[0x19])(pAVar7,&font,pcVar8,sVar9 & 0xffffffff);
  if ((iVar3 < 1) || (iVar4 <= iVar5 - iVar3)) {
    if (-1 < (int)uVar2) {
      Am_Object::Am_Object(&local_50,self);
      pAVar7 = GV_a_drawonable(&local_50);
      Am_Object::~Am_Object(&local_50);
      pAVar6 = Am_Object::Get(self,0xae,0);
      iVar5 = Am_Value::operator_cast_to_int(pAVar6);
      if (iVar5 < iVar3) {
        if (iVar5 == 0) {
          iVar3 = 0;
        }
        else {
          pcVar8 = Am_String::operator_cast_to_char_(&str);
          uVar10 = sVar9 & 0xffffffff;
          if ((int)uVar2 < (int)sVar9) {
            uVar10 = (ulong)uVar2;
          }
          iVar3 = (*pAVar7->_vptr_Am_Drawonable[0x19])(pAVar7,&font,pcVar8,uVar10);
        }
      }
      else if (iVar4 + iVar3 < iVar5) {
        pcVar8 = Am_String::operator_cast_to_char_(&str);
        uVar10 = sVar9 & 0xffffffff;
        if ((int)uVar2 < (int)sVar9) {
          uVar10 = (ulong)uVar2;
        }
        iVar5 = (*pAVar7->_vptr_Am_Drawonable[0x19])(pAVar7,&font,pcVar8,uVar10);
        goto LAB_001f1838;
      }
    }
  }
  else {
LAB_001f1838:
    iVar3 = 0;
    if (0 < iVar5 - iVar4) {
      iVar3 = iVar5 - iVar4;
    }
  }
  Am_Font::~Am_Font(&font);
  Am_Value::~Am_Value(&old_string_offset_value);
LAB_001f1912:
  Am_String::~Am_String(&str);
  return iVar3;
}

Assistant:

Am_Define_Formula(int, compute_string_offset)
{
  Am_String str;
  str = self.Get(Am_TEXT);
  if (!str.Valid())
    return 0; // no string in there, so offset 0.

  int cursor_index = self.Get(Am_CURSOR_INDEX);
  // get old value of this slot
  int old_string_offset;
  Am_Value old_string_offset_value;
  old_string_offset_value = self.Peek(Am_X_OFFSET, Am_NO_DEPENDENCY);
  if (!old_string_offset_value.Exists())
    old_string_offset = 0;
  else
    old_string_offset = old_string_offset_value;

  int new_offset = old_string_offset;
  int width = self.Get(Am_WIDTH);
  Am_Drawonable *drawonable = GV_a_drawonable(self);
  Am_Font font(self.Get(Am_FONT));

  int max_cursor_index = strlen(str);
  int full_string_width =
      drawonable->Get_String_Width(font, str, max_cursor_index);
  if (old_string_offset > 0 && full_string_width - old_string_offset < width) {
    //then need to scroll because width changed
    new_offset = imax(0, full_string_width - width);
  } else if (cursor_index >= 0) { //otherwise, don't change position
    Am_Drawonable *drawonable = GV_a_drawonable(self);
    int cursor_offset = self.Get(Am_CURSOR_OFFSET);
    if (cursor_offset < old_string_offset) { // then scroll right
      if (cursor_offset == 0)
        new_offset = 0;
      else {
        // find the position of the character at the cursor
        cursor_index = imin(imax(0, cursor_index), max_cursor_index);
        new_offset = drawonable->Get_String_Width(font, str, cursor_index);
      }
    } else {
      if (cursor_offset > old_string_offset + width) { // scroll left
        // find the position of the character at the cursor
        cursor_index = imin(imax(0, cursor_index), max_cursor_index);
        new_offset = drawonable->Get_String_Width(font, str, cursor_index);
        new_offset = new_offset - width;
        if (new_offset < 0)
          new_offset = 0;
      }
    }
  }
  return new_offset;
}